

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inter.h
# Opt level: O1

void __thiscall Break::gen(Break *this,int b,int a)

{
  stringstream ss;
  string local_1b8;
  stringstream local_198 [16];
  ostream local_188 [112];
  ios_base local_118 [264];
  
  std::__cxx11::stringstream::stringstream(local_198);
  std::__ostream_insert<char,std::char_traits<char>>(local_188,"goto L",6);
  std::ostream::operator<<
            (local_188,
             *(int *)&(((this->stmt).super___shared_ptr<Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      super_Node).field_0xc);
  std::__cxx11::stringbuf::str();
  Node::emit((Node *)this,&local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_198);
  std::ios_base::~ios_base(local_118);
  return;
}

Assistant:

void gen(int b, int a) override {
		std::stringstream ss;
		ss << "goto L" << stmt->after;
		emit(ss.str());
	}